

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O2

LOs __thiscall Omega_h::invert_funnel(Omega_h *this,LOs *ab2a,LO na)

{
  Alloc *pAVar1;
  int value;
  int iVar2;
  void *extraout_RDX;
  uint uVar3;
  uint i;
  long lVar4;
  size_t sVar5;
  LOs LVar6;
  Write<int> a2ab;
  string local_b8;
  Alloc *local_98;
  Write<int> local_90;
  Write<int> local_80;
  Write<int> local_70;
  Write<int> local_60;
  type f;
  
  pAVar1 = (ab2a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar5 = pAVar1->size;
  }
  else {
    sVar5 = (ulong)pAVar1 >> 3;
  }
  std::__cxx11::string::string((string *)&local_b8,"",(allocator *)&local_70);
  Write<int>::Write(&a2ab,na + 1,-1,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  Write<int>::set(&a2ab,0,0);
  Write<int>::Write((Write<int> *)&f,&ab2a->write_);
  local_98 = (Alloc *)this;
  Write<int>::Write(&f.a2ab,&a2ab);
  value = (int)(sVar5 >> 2);
  i = value - 1;
  uVar3 = 0;
  if (0 < (int)i) {
    uVar3 = i;
  }
  Write<int>::Write(&local_70,(Write<int> *)&f);
  Write<int>::Write(&local_60,&f.a2ab);
  if (1 < value) {
    entering_parallel = 1;
    Write<int>::Write((Write<int> *)&local_b8,&local_70);
    Write<int>::Write((Write<int> *)&local_b8.field_2,&local_60);
    entering_parallel = 0;
    for (lVar4 = 1; lVar4 - (ulong)uVar3 != 1; lVar4 = lVar4 + 1) {
      iVar2 = *(int *)(local_b8._M_string_length + lVar4 * 4 + -4);
      if (iVar2 != *(int *)(local_b8._M_string_length + lVar4 * 4)) {
        *(int *)(local_b8.field_2._8_8_ + 4 + (long)iVar2 * 4) = (int)lVar4;
      }
    }
    invert_funnel(Omega_h::Read<int>,int)::$_0::~__0((__0 *)&local_b8);
  }
  invert_funnel(Omega_h::Read<int>,int)::$_0::~__0((__0 *)&local_70);
  if (value != 0) {
    iVar2 = Read<int>::get((Read<signed_char> *)ab2a,i);
    Write<int>::set(&a2ab,iVar2 + 1,value);
  }
  Write<int>::Write(&local_80,&a2ab);
  fill_right(&local_80);
  Write<int>::~Write(&local_80);
  Write<int>::Write(&local_90,&a2ab);
  pAVar1 = local_98;
  Read<int>::Read((Read<signed_char> *)local_98,&local_90);
  Write<int>::~Write(&local_90);
  invert_funnel(Omega_h::Read<int>,int)::$_0::~__0((__0 *)&f);
  Write<int>::~Write(&a2ab);
  LVar6.write_.shared_alloc_.direct_ptr = extraout_RDX;
  LVar6.write_.shared_alloc_.alloc = pAVar1;
  return (LOs)LVar6.write_.shared_alloc_;
}

Assistant:

LOs invert_funnel(LOs ab2a, LO na) {
  LO nab = ab2a.size();
  Write<LO> a2ab(na + 1, -1);
  a2ab.set(0, 0);
  auto f = OMEGA_H_LAMBDA(LO ab) {
    LO a_end = ab2a[ab];
    LO a_start = ab2a[ab + 1];
    if (a_end != a_start) {
      a2ab[a_end + 1] = ab + 1;
    }
  };
  parallel_for(max2(0, nab - 1), f, "invert_funnel");
  if (nab) {
    LO a_end = ab2a.get(nab - 1);
    a2ab.set(a_end + 1, nab);
  }
  fill_right(a2ab);
  return a2ab;
}